

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::BuiltinSerializer<std::forward_list<int,_std::allocator<int>_>,_void>::
     serialize_elems<OutputStream>(long *param_1,undefined8 param_2,OutputStream *param_3)

{
  while (param_1 = (long *)*param_1, param_1 != (long *)0x0) {
    serialize<int,OutputStream>((int *)(param_1 + 1),param_3);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }